

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManDeriveDivPair(int iDiv,Vec_Ptr_t *vDivs,int nWords,word *pRes)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  word *pIn1;
  word *pIn2;
  word *pDiv1;
  word *pDiv0;
  int iDiv1;
  int iDiv0;
  int fComp;
  word *pRes_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  int iDiv_local;
  
  iVar1 = Abc_LitIsCompl(iDiv);
  uVar2 = Abc_Lit2Var(iDiv);
  uVar2 = uVar2 & 0x7fff;
  iVar3 = Abc_Lit2Var(iDiv);
  iVar3 = iVar3 >> 0xf;
  iVar4 = Abc_Lit2Var(uVar2);
  pIn1 = (word *)Vec_PtrEntry(vDivs,iVar4);
  iVar4 = Abc_Lit2Var(iVar3);
  pIn2 = (word *)Vec_PtrEntry(vDivs,iVar4);
  if ((int)uVar2 < iVar3) {
    if (iVar1 != 0) {
      __assert_fail("!fComp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x375,"void Gia_ManDeriveDivPair(int, Vec_Ptr_t *, int, word *)");
    }
    iVar1 = Abc_LitIsCompl(uVar2);
    iVar3 = Abc_LitIsCompl(iVar3);
    Abc_TtAndCompl(pRes,pIn1,iVar1,pIn2,iVar3,nWords);
  }
  else {
    iVar1 = Abc_LitIsCompl(uVar2);
    if (iVar1 != 0) {
      __assert_fail("!Abc_LitIsCompl(iDiv0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x37a,"void Gia_ManDeriveDivPair(int, Vec_Ptr_t *, int, word *)");
    }
    iVar1 = Abc_LitIsCompl(iVar3);
    if (iVar1 != 0) {
      __assert_fail("!Abc_LitIsCompl(iDiv1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                    ,0x37b,"void Gia_ManDeriveDivPair(int, Vec_Ptr_t *, int, word *)");
    }
    Abc_TtXor(pRes,pIn1,pIn2,nWords,0);
  }
  return;
}

Assistant:

void Gia_ManDeriveDivPair( int iDiv, Vec_Ptr_t * vDivs, int nWords, word * pRes )
{
    int fComp = Abc_LitIsCompl(iDiv);
    int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;
    int iDiv1 = Abc_Lit2Var(iDiv) >> 15;
    word * pDiv0 = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iDiv0));
    word * pDiv1 = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iDiv1));
    if ( iDiv0 < iDiv1 )
    {
        assert( !fComp );
        Abc_TtAndCompl( pRes, pDiv0, Abc_LitIsCompl(iDiv0), pDiv1, Abc_LitIsCompl(iDiv1), nWords );
    }
    else 
    {
        assert( !Abc_LitIsCompl(iDiv0) );
        assert( !Abc_LitIsCompl(iDiv1) );
        Abc_TtXor( pRes, pDiv0, pDiv1, nWords, 0 );
    }
}